

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

int32 __thiscall Func::StackAllocate(Func *this,StackSym *stackSym,int size)

{
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  undefined4 *puVar4;
  int size_local;
  StackSym *stackSym_local;
  Func *this_local;
  
  if (size < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x2ce,"(size > 0)","size > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = StackSym::IsArgSlotSym(stackSym);
  if (((!bVar2) && (bVar2 = StackSym::IsParamSlotSym(stackSym), !bVar2)) &&
     (bVar2 = StackSym::IsAllocated(stackSym), !bVar2)) {
    if (stackSym->m_offset != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x2d3,"(stackSym->m_offset == 0)","stackSym->m_offset == 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    *(uint *)&stackSym->field_0x18 = *(uint *)&stackSym->field_0x18 & 0xffffefff | 0x1000;
    iVar3 = StackAllocate(this,size);
    stackSym->m_offset = iVar3;
    return stackSym->m_offset;
  }
  return stackSym->m_offset;
}

Assistant:

int32
Func::StackAllocate(StackSym *stackSym, int size)
{
    Assert(size > 0);
    if (stackSym->IsArgSlotSym() || stackSym->IsParamSlotSym() || stackSym->IsAllocated())
    {
        return stackSym->m_offset;
    }
    Assert(stackSym->m_offset == 0);
    stackSym->m_allocated = true;
    stackSym->m_offset = StackAllocate(size);

    return stackSym->m_offset;
}